

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjPrintVerilog(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  int c;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  char *pcVar4;
  bool local_61;
  int local_58;
  int i;
  int fCompl;
  Aig_Obj_t *pFaninC;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pFanin;
  Vec_Ptr_t *vSuper;
  Vec_Vec_t *pVStack_20;
  int Level_local;
  Vec_Vec_t *vLevels_local;
  Aig_Obj_t *pObj_local;
  FILE *pFile_local;
  
  vSuper._4_4_ = Level;
  pVStack_20 = vLevels;
  vLevels_local = (Vec_Vec_t *)pObj;
  pObj_local = (Aig_Obj_t *)pFile;
  c = Aig_IsComplement(pObj);
  vLevels_local = (Vec_Vec_t *)Aig_Regular((Aig_Obj_t *)vLevels_local);
  iVar1 = Aig_ObjIsConst1((Aig_Obj_t *)vLevels_local);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsCi((Aig_Obj_t *)vLevels_local);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsExor((Aig_Obj_t *)vLevels_local);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsMuxType((Aig_Obj_t *)vLevels_local);
        if (iVar1 == 0) {
          Vec_VecExpand(pVStack_20,vSuper._4_4_);
          pFanin = (Aig_Obj_t *)Vec_VecEntry(pVStack_20,vSuper._4_4_);
          Aig_ObjCollectMulti((Aig_Obj_t *)vLevels_local,(Vec_Ptr_t *)pFanin);
          pcVar4 = "(";
          if (vSuper._4_4_ == 0) {
            pcVar4 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar4);
          for (local_58 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pFanin), local_58 < iVar1;
              local_58 = local_58 + 1) {
            pFanin0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pFanin,local_58);
            pAVar3 = pObj_local;
            pAVar2 = Aig_NotCond(pFanin0,c);
            Aig_ObjPrintVerilog((FILE *)pAVar3,pAVar2,pVStack_20,vSuper._4_4_ + 1);
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)pFanin);
            if (local_58 < iVar1 + -1) {
              pcVar4 = "&";
              if (c != 0) {
                pcVar4 = "|";
              }
              fprintf((FILE *)pObj_local," %s ",pcVar4);
            }
          }
          pcVar4 = ")";
          if (vSuper._4_4_ == 0) {
            pcVar4 = "";
          }
          fprintf((FILE *)pObj_local,"%s",pcVar4);
        }
        else {
          iVar1 = Aig_ObjRecognizeExor((Aig_Obj_t *)vLevels_local,&pFanin1,&pFaninC);
          if (iVar1 == 0) {
            pAVar3 = Aig_ObjRecognizeMux((Aig_Obj_t *)vLevels_local,&pFaninC,&pFanin1);
            pcVar4 = "(";
            if (vSuper._4_4_ == 0) {
              pcVar4 = "";
            }
            fprintf((FILE *)pObj_local,"%s",pcVar4);
            Aig_ObjPrintVerilog((FILE *)pObj_local,pAVar3,pVStack_20,vSuper._4_4_ + 1);
            fprintf((FILE *)pObj_local," ? ");
            pAVar3 = pObj_local;
            pAVar2 = Aig_NotCond(pFaninC,c);
            Aig_ObjPrintVerilog((FILE *)pAVar3,pAVar2,pVStack_20,vSuper._4_4_ + 1);
            fprintf((FILE *)pObj_local," : ");
            pAVar3 = pObj_local;
            pAVar2 = Aig_NotCond(pFanin1,c);
            Aig_ObjPrintVerilog((FILE *)pAVar3,pAVar2,pVStack_20,vSuper._4_4_ + 1);
            pcVar4 = ")";
            if (vSuper._4_4_ == 0) {
              pcVar4 = "";
            }
            fprintf((FILE *)pObj_local,"%s",pcVar4);
          }
          else {
            pcVar4 = "(";
            if (vSuper._4_4_ == 0) {
              pcVar4 = "";
            }
            fprintf((FILE *)pObj_local,"%s",pcVar4);
            pAVar3 = pObj_local;
            pAVar2 = Aig_NotCond(pFanin1,c);
            Aig_ObjPrintVerilog((FILE *)pAVar3,pAVar2,pVStack_20,vSuper._4_4_ + 1);
            fprintf((FILE *)pObj_local," ^ ");
            Aig_ObjPrintVerilog((FILE *)pObj_local,pFaninC,pVStack_20,vSuper._4_4_ + 1);
            pcVar4 = ")";
            if (vSuper._4_4_ == 0) {
              pcVar4 = "";
            }
            fprintf((FILE *)pObj_local,"%s",pcVar4);
          }
        }
      }
      else {
        Vec_VecExpand(pVStack_20,vSuper._4_4_);
        pFanin = (Aig_Obj_t *)Vec_VecEntry(pVStack_20,vSuper._4_4_);
        Aig_ObjCollectMulti((Aig_Obj_t *)vLevels_local,(Vec_Ptr_t *)pFanin);
        pcVar4 = "(";
        if (vSuper._4_4_ == 0) {
          pcVar4 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar4);
        for (local_58 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pFanin), local_58 < iVar1;
            local_58 = local_58 + 1) {
          pFanin0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pFanin,local_58);
          pAVar3 = pObj_local;
          local_61 = c != 0 && local_58 == 0;
          pAVar2 = Aig_NotCond(pFanin0,(uint)local_61);
          Aig_ObjPrintVerilog((FILE *)pAVar3,pAVar2,pVStack_20,vSuper._4_4_ + 1);
          iVar1 = Vec_PtrSize((Vec_Ptr_t *)pFanin);
          if (local_58 < iVar1 + -1) {
            fprintf((FILE *)pObj_local," ^ ");
          }
        }
        pcVar4 = ")";
        if (vSuper._4_4_ == 0) {
          pcVar4 = "";
        }
        fprintf((FILE *)pObj_local,"%s",pcVar4);
      }
    }
    else {
      pcVar4 = "";
      if (c != 0) {
        pcVar4 = "~";
      }
      fprintf((FILE *)pObj_local,"%s%s",pcVar4,vLevels_local[2].pArray);
    }
  }
  else {
    fprintf((FILE *)pObj_local,"1\'b%d",(ulong)((c != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void Aig_ObjPrintVerilog( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( Aig_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Aig_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        {
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1 );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( Aig_ObjIsMuxType(pObj) )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, " ^ " );
            Aig_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Aig_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1 );
            fprintf( pFile, " ? " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin1, fCompl), vLevels, Level+1 );
            fprintf( pFile, " : " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}